

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.h
# Opt level: O2

size_t absl::lts_20250127::log_internal::BufferSizeFor(uint64_t tag,WireType type)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = VarintSize(tag << 3 | type);
  switch(type) {
  case kVarint:
  case kLengthDelimited:
    sVar2 = MaxVarintSize();
    sVar1 = sVar1 + sVar2;
    break;
  case k64Bit:
    sVar1 = sVar1 + 8;
    break;
  case k32Bit:
    sVar1 = sVar1 + 4;
  }
  return sVar1;
}

Assistant:

constexpr size_t BufferSizeFor(uint64_t tag, WireType type) {
  size_t buffer_size = VarintSize(MakeTagType(tag, type));
  switch (type) {
    case WireType::kVarint:
      buffer_size += MaxVarintSize();
      break;
    case WireType::k64Bit:
      buffer_size += size_t{8};
      break;
    case WireType::kLengthDelimited:
      buffer_size += MaxVarintSize();
      break;
    case WireType::k32Bit:
      buffer_size += size_t{4};
      break;
  }
  return buffer_size;
}